

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O2

C_Node * mul(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  C_NodeKind CVar1;
  C_Token *pCVar2;
  _Bool _Var3;
  C_Node *pCVar4;
  C_Node *pCVar5;
  C_Node *pCVar6;
  C_Token *tok_local;
  C_Token **local_38;
  
  tok_local = tok;
  local_38 = rest;
  pCVar4 = cast(parser,&tok_local,tok);
  do {
    pCVar2 = tok_local;
    _Var3 = C_equal(tok_local,"*");
    if (_Var3) {
      CVar1 = ND_MUL;
    }
    else {
      _Var3 = C_equal(tok_local,"/");
      if (_Var3) {
        CVar1 = ND_DIV;
      }
      else {
        _Var3 = C_equal(tok_local,"%");
        if (!_Var3) {
          *local_38 = tok_local;
          return pCVar4;
        }
        CVar1 = ND_MOD;
      }
    }
    pCVar5 = cast(parser,&tok_local,tok_local->next);
    pCVar6 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar6->kind = CVar1;
    pCVar6->tok = pCVar2;
    pCVar6->lhs = pCVar4;
    pCVar6->rhs = pCVar5;
    pCVar4 = pCVar6;
  } while( true );
}

Assistant:

static C_Node *mul(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Node *node = cast(parser, &tok, tok);

  for (;;) {
    C_Token *start = tok;

    if (C_equal(tok, "*")) {
      node = new_binary(parser, ND_MUL, node, cast(parser, &tok, tok->next), start);
      continue;
    }

    if (C_equal(tok, "/")) {
      node = new_binary(parser, ND_DIV, node, cast(parser, &tok, tok->next), start);
      continue;
    }

    if (C_equal(tok, "%")) {
      node = new_binary(parser, ND_MOD, node, cast(parser, &tok, tok->next), start);
      continue;
    }

    *rest = tok;
    return node;
  }
}